

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

object * wiz_create_object_from_artifact(artifact *art)

{
  object_kind *k;
  object *obj;
  object_kind *kind;
  artifact *art_local;
  
  if (art->name == (char *)0x0) {
    art_local = (artifact *)0x0;
  }
  else {
    k = lookup_kind(art->tval,art->sval);
    if (k == (object_kind *)0x0) {
      art_local = (artifact *)0x0;
    }
    else {
      art_local = (artifact *)object_new();
      object_prep((object *)art_local,k,art->alloc_min,RANDOMISE);
      ((object *)art_local)->artifact = art;
      copy_artifact_data((object *)art_local,art);
      mark_artifact_created(art,true);
    }
  }
  return (object *)art_local;
}

Assistant:

static struct object *wiz_create_object_from_artifact(const struct artifact *art)
{
	struct object_kind *kind;
	struct object *obj;

	/* Ignore "empty" artifacts */
	if (!art->name) return NULL;

	/* Acquire the "kind" index */
	kind = lookup_kind(art->tval, art->sval);
	if (!kind) return NULL;

	/* Create the artifact */
	obj = object_new();
	object_prep(obj, kind, art->alloc_min, RANDOMISE);
	obj->artifact = art;
	copy_artifact_data(obj, art);

	mark_artifact_created(art, true);

	return obj;
}